

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int set_sort(lyxp_set *set,lyd_node *cur_node,int options)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  lyd_node *root_00;
  lyxp_set_node *plVar5;
  lyxp_set_node *plVar6;
  uint64_t hash;
  lyxp_set_hash_node hnode;
  lyxp_set_node item;
  lyxp_node_type root_type;
  lyd_node *root;
  int change;
  int inverted;
  int cmp;
  int ret;
  uint32_t j;
  uint32_t i;
  int options_local;
  lyd_node *cur_node_local;
  lyxp_set *set_local;
  
  inverted = 0;
  if ((set->type == LYXP_SET_NODE_SET) && (set->used != 1)) {
    root_00 = moveto_get_root(cur_node,options,&item.pos);
    iVar3 = set_assign_pos(set,root_00,item.pos);
    if (iVar3 == 0) {
      ly_log_dbg(8,"SORT BEGIN");
      print_set_debug(set);
      for (ret = 0; (uint)ret < set->used; ret = ret + 1) {
        bVar2 = false;
        bVar1 = false;
        for (cmp = 1; (uint)cmp < set->used - ret; cmp = cmp + 1) {
          if (bVar2) {
            iVar3 = set_sort_compare((set->val).nodes + (uint)cmp,(set->val).nodes + (cmp - 1),
                                     root_00);
            if (-1 < iVar3) goto LAB_001b12a9;
LAB_001b12bd:
            bVar1 = true;
            hnode._4_8_ = (set->val).nodes[cmp - 1].node;
            item.node = *(lyd_node **)&(set->val).nodes[cmp - 1].type;
            plVar5 = (set->val).nodes + (cmp - 1);
            plVar6 = (set->val).nodes + (uint)cmp;
            plVar5->node = plVar6->node;
            uVar4 = plVar6->pos;
            plVar5->type = plVar6->type;
            plVar5->pos = uVar4;
            plVar5 = (set->val).nodes;
            plVar5[(uint)cmp].node = (lyd_node *)hnode._4_8_;
            *(lyd_node **)&plVar5[(uint)cmp].type = item.node;
          }
          else {
            iVar3 = set_sort_compare((set->val).nodes + (cmp - 1),(set->val).nodes + (uint)cmp,
                                     root_00);
LAB_001b12a9:
            if ((!bVar2) && (0 < iVar3)) goto LAB_001b12bd;
            bVar2 = (bool)(bVar2 ^ 1);
          }
        }
        inverted = inverted + 1;
        if (!bVar1) break;
      }
      ly_log_dbg(8,"SORT END %d",(ulong)(uint)inverted);
      print_set_debug(set);
      if (3 < set->used) {
        if (set->ht == (hash_table *)0x0) {
          __assert_fail("set->ht",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x604,"int set_sort(struct lyxp_set *, const struct lyd_node *, int)");
        }
        for (ret = 0; (uint)ret < set->used; ret = ret + 1) {
          unique0x00012000 = (set->val).nodes[(uint)ret].node;
          hnode.node._0_4_ = (set->val).nodes[(uint)ret].type;
          uVar4 = dict_hash_multi(0,(char *)((long)&hash + 4),8);
          uVar4 = dict_hash_multi(uVar4,(char *)&hnode,4);
          uVar4 = dict_hash_multi(uVar4,(char *)0x0,0);
          iVar3 = lyht_find(set->ht,(void *)((long)&hash + 4),uVar4,(void **)0x0);
          if (iVar3 != 0) {
            __assert_fail("!lyht_find(set->ht, &hnode, hash, NULL)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                          ,0x60d,"int set_sort(struct lyxp_set *, const struct lyd_node *, int)");
          }
        }
      }
      set_local._4_4_ = inverted + -1;
    }
    else {
      set_local._4_4_ = -1;
    }
  }
  else {
    set_local._4_4_ = 0;
  }
  return set_local._4_4_;
}

Assistant:

static int
set_sort(struct lyxp_set *set, const struct lyd_node *cur_node, int options)
{
    uint32_t i, j;
    int ret = 0, cmp, inverted, change;
    const struct lyd_node *root;
    enum lyxp_node_type root_type;
    struct lyxp_set_node item;

    if ((set->type != LYXP_SET_NODE_SET) || (set->used == 1)) {
        return 0;
    }

    /* get root */
    root = moveto_get_root(cur_node, options, &root_type);

    /* fill positions */
    if (set_assign_pos(set, root, root_type)) {
        return -1;
    }

    LOGDBG(LY_LDGXPATH, "SORT BEGIN");
    print_set_debug(set);

    for (i = 0; i < set->used; ++i) {
        inverted = 0;
        change = 0;

        for (j = 1; j < set->used - i; ++j) {
            /* compare node positions */
            if (inverted) {
                cmp = set_sort_compare(&set->val.nodes[j], &set->val.nodes[j - 1], root);
            } else {
                cmp = set_sort_compare(&set->val.nodes[j - 1], &set->val.nodes[j], root);
            }

            /* swap if needed */
            if ((inverted && (cmp < 0)) || (!inverted && (cmp > 0))) {
                change = 1;

                item = set->val.nodes[j - 1];
                set->val.nodes[j - 1] = set->val.nodes[j];
                set->val.nodes[j] = item;
            } else {
                /* whether node_pos1 should be smaller than node_pos2 or the other way around */
                inverted = !inverted;
            }
        }

        ++ret;

        if (!change) {
            break;
        }
    }

    LOGDBG(LY_LDGXPATH, "SORT END %d", ret);
    print_set_debug(set);

#ifdef LY_ENABLED_CACHE
    struct lyxp_set_hash_node hnode;
    uint64_t hash;

    /* check node hashes */
    if (set->used >= LY_CACHE_HT_MIN_CHILDREN) {
        assert(set->ht);
        for (i = 0; i < set->used; ++i) {
            hnode.node = set->val.nodes[i].node;
            hnode.type = set->val.nodes[i].type;

            hash = dict_hash_multi(0, (const char *)&hnode.node, sizeof hnode.node);
            hash = dict_hash_multi(hash, (const char *)&hnode.type, sizeof hnode.type);
            hash = dict_hash_multi(hash, NULL, 0);

            assert(!lyht_find(set->ht, &hnode, hash, NULL));
        }
    }
#endif

    return ret - 1;
}